

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpstream.cpp
# Opt level: O2

string * __thiscall TCPStream::getPeerIP_abi_cxx11_(string *__return_storage_ptr__,TCPStream *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_peerIP);
  return __return_storage_ptr__;
}

Assistant:

std::string TCPStream::getPeerIP()
{
    return m_peerIP;
}